

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

ActionDiscrete * __thiscall
MADPComponentDiscreteActions::GetActionDiscrete
          (MADPComponentDiscreteActions *this,Index agentI,Index a)

{
  ostream *poVar1;
  undefined8 uVar2;
  size_type sVar3;
  ulong uVar4;
  size_t sVar5;
  const_reference this_00;
  const_reference pvVar6;
  E *this_01;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  stringstream ss;
  stringstream ss_2;
  stringstream ss_1;
  stringstream *in_stack_fffffffffffffae8;
  E *in_stack_fffffffffffffaf0;
  stringstream local_4b8 [16];
  ostream local_4a8 [324];
  Index in_stack_fffffffffffffc9c;
  MADPComponentDiscreteActions *in_stack_fffffffffffffca0;
  stringstream local_330 [16];
  ostream local_320 [392];
  stringstream local_198 [16];
  ostream local_188 [376];
  uint local_10;
  uint local_c;
  
  local_c = in_ESI;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"MADPComponentDiscreteActions::GetAction(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  local_10 = in_EDX;
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40));
  if (in_ESI < sVar3) {
    uVar4 = (ulong)local_10;
    sVar5 = GetNrActions(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
    if (uVar4 < sVar5) {
      this_00 = std::
                vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                ::operator[]((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                              *)(in_RDI + 0x58),(ulong)local_c);
      pvVar6 = std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::operator[]
                         (this_00,(ulong)local_10);
      return pvVar6;
    }
    std::__cxx11::stringstream::stringstream(local_330);
    poVar1 = std::operator<<(local_320,
                             "WARNING MADPComponentDiscreteActions::GetAction(Index agentI, Index a) index a out of bounds"
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream(local_4b8);
  poVar1 = std::operator<<(local_4a8,
                           "WARNING MADPComponentDiscreteActions::GetAction(Index agentI, Index a) index agentI out of bounds"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_01 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_01,in_stack_fffffffffffffae8);
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

const ActionDiscrete* MADPComponentDiscreteActions::GetActionDiscrete(Index agentI, Index a) const
{
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "MADPComponentDiscreteActions::GetAction("<< 
            agentI<<") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(agentI < _m_nrActions.size() )
    {
        if(a < GetNrActions(agentI) )
        {
            return (&_m_actionVecs[agentI][a]);
        }
        //else
        stringstream ss;
            ss << "WARNING MADPComponentDiscreteActions::GetAction(Index agentI, Index a) index a out of bounds"<<endl;
        throw E(ss);
    }
    //else
    stringstream ss;
    ss << "WARNING MADPComponentDiscreteActions::GetAction(Index agentI, Index a) index agentI out of bounds"<<endl;   
    throw E(ss);
}